

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

ASTCBlockMode *
tcu::astc::anon_unknown_0::getASTCBlockMode
          (ASTCBlockMode *__return_storage_ptr__,deUint32 blockModeData)

{
  bool bVar1;
  bool bVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  int *piVar8;
  int iVar9;
  ISEParams *pIVar10;
  int local_7c;
  int local_78;
  ASTCBlockMode *blockMode;
  int *b_2;
  ISEMode *m;
  bool h;
  bool zeroDH;
  deUint32 b_1;
  bool i8;
  deUint32 b;
  deUint32 a_1;
  deUint32 i23;
  deUint32 r2_1;
  deUint32 r1_1;
  deUint32 r0_1;
  deUint32 a;
  bool i5;
  deUint32 i78;
  deUint32 r2;
  deUint32 r1;
  deUint32 r0;
  deUint32 r;
  deUint32 blockModeData_local;
  
  ASTCBlockMode::ASTCBlockMode(__return_storage_ptr__);
  __return_storage_ptr__->isError = true;
  dVar3 = getBits(blockModeData,0,8);
  __return_storage_ptr__->isVoidExtent = dVar3 == 0x1fc;
  if ((__return_storage_ptr__->isVoidExtent & 1U) == 0) {
    dVar3 = getBits(blockModeData,0,1);
    if ((dVar3 == 0) && (dVar3 = getBits(blockModeData,6,8), dVar3 == 7)) {
      return __return_storage_ptr__;
    }
    dVar3 = getBits(blockModeData,0,3);
    if (dVar3 == 0) {
      return __return_storage_ptr__;
    }
    dVar3 = getBits(blockModeData,0,1);
    if (dVar3 == 0) {
      dVar3 = getBit(blockModeData,4);
      dVar4 = getBit(blockModeData,2);
      dVar5 = getBit(blockModeData,3);
      dVar6 = getBits(blockModeData,7,8);
      r1 = dVar5 << 2 | dVar4 << 1 | dVar3;
      if (dVar6 == 3) {
        bVar1 = isBitSet(blockModeData,5);
        iVar9 = 6;
        if (bVar1) {
          iVar9 = 10;
        }
        __return_storage_ptr__->weightGridWidth = iVar9;
        iVar9 = 10;
        if (bVar1) {
          iVar9 = 6;
        }
        __return_storage_ptr__->weightGridHeight = iVar9;
      }
      else {
        dVar3 = getBits(blockModeData,5,6);
        if (dVar6 == 0) {
          __return_storage_ptr__->weightGridWidth = 0xc;
          __return_storage_ptr__->weightGridHeight = dVar3 + 2;
        }
        else if (dVar6 == 1) {
          __return_storage_ptr__->weightGridWidth = dVar3 + 2;
          __return_storage_ptr__->weightGridHeight = 0xc;
        }
        else if (dVar6 == 2) {
          __return_storage_ptr__->weightGridWidth = dVar3 + 6;
          dVar3 = getBits(blockModeData,9,10);
          __return_storage_ptr__->weightGridHeight = dVar3 + 6;
        }
      }
    }
    else {
      dVar3 = getBit(blockModeData,4);
      dVar4 = getBit(blockModeData,0);
      dVar5 = getBit(blockModeData,1);
      dVar6 = getBits(blockModeData,2,3);
      dVar7 = getBits(blockModeData,5,6);
      r1 = dVar5 << 2 | dVar4 << 1 | dVar3;
      if (dVar6 == 3) {
        dVar4 = getBit(blockModeData,7);
        bVar1 = isBitSet(blockModeData,8);
        dVar3 = dVar7;
        if (bVar1) {
          dVar3 = dVar4;
        }
        local_78 = dVar3 + 2;
        __return_storage_ptr__->weightGridWidth = local_78;
        if (bVar1) {
          local_7c = dVar7 + 2;
        }
        else {
          local_7c = dVar4 + 6;
        }
        __return_storage_ptr__->weightGridHeight = local_7c;
      }
      else {
        dVar3 = getBits(blockModeData,7,8);
        if (dVar6 == 0) {
          __return_storage_ptr__->weightGridWidth = dVar3 + 4;
          __return_storage_ptr__->weightGridHeight = dVar7 + 2;
        }
        else if (dVar6 == 1) {
          __return_storage_ptr__->weightGridWidth = dVar3 + 8;
          __return_storage_ptr__->weightGridHeight = dVar7 + 2;
        }
        else if (dVar6 == 2) {
          __return_storage_ptr__->weightGridWidth = dVar7 + 2;
          __return_storage_ptr__->weightGridHeight = dVar3 + 8;
        }
      }
    }
    dVar3 = getBits(blockModeData,0,1);
    bVar1 = false;
    if (dVar3 == 0) {
      dVar3 = getBits(blockModeData,7,8);
      bVar1 = dVar3 == 2;
    }
    if (bVar1) {
      bVar2 = false;
    }
    else {
      bVar2 = isBitSet(blockModeData,9);
    }
    if (bVar1) {
      bVar1 = false;
    }
    else {
      bVar1 = isBitSet(blockModeData,10);
    }
    __return_storage_ptr__->isDualPlane = bVar1 != false;
    pIVar10 = &__return_storage_ptr__->weightISEParams;
    piVar8 = &(__return_storage_ptr__->weightISEParams).numBits;
    pIVar10->mode = ISEMODE_PLAIN_BIT;
    *piVar8 = 0;
    if (bVar2 == false) {
      switch(r1) {
      case 2:
        *piVar8 = 1;
        break;
      case 3:
        pIVar10->mode = ISEMODE_TRIT;
        break;
      case 4:
        *piVar8 = 2;
        break;
      case 5:
        pIVar10->mode = ISEMODE_QUINT;
        break;
      case 6:
        pIVar10->mode = ISEMODE_TRIT;
        *piVar8 = 1;
        break;
      case 7:
        *piVar8 = 3;
      }
    }
    else {
      switch(r1) {
      case 2:
        pIVar10->mode = ISEMODE_QUINT;
        *piVar8 = 1;
        break;
      case 3:
        pIVar10->mode = ISEMODE_TRIT;
        *piVar8 = 2;
        break;
      case 4:
        *piVar8 = 4;
        break;
      case 5:
        pIVar10->mode = ISEMODE_QUINT;
        *piVar8 = 2;
        break;
      case 6:
        pIVar10->mode = ISEMODE_TRIT;
        *piVar8 = 3;
        break;
      case 7:
        *piVar8 = 5;
      }
    }
  }
  __return_storage_ptr__->isError = false;
  return __return_storage_ptr__;
}

Assistant:

ASTCBlockMode getASTCBlockMode (deUint32 blockModeData)
{
	ASTCBlockMode blockMode;
	blockMode.isError = true; // \note Set to false later, if not error.

	blockMode.isVoidExtent = getBits(blockModeData, 0, 8) == 0x1fc;

	if (!blockMode.isVoidExtent)
	{
		if ((getBits(blockModeData, 0, 1) == 0 && getBits(blockModeData, 6, 8) == 7) || getBits(blockModeData, 0, 3) == 0)
			return blockMode; // Invalid ("reserved").

		deUint32 r = (deUint32)-1; // \note Set in the following branches.

		if (getBits(blockModeData, 0, 1) == 0)
		{
			const deUint32 r0	= getBit(blockModeData, 4);
			const deUint32 r1	= getBit(blockModeData, 2);
			const deUint32 r2	= getBit(blockModeData, 3);
			const deUint32 i78	= getBits(blockModeData, 7, 8);

			r = (r2 << 2) | (r1 << 1) | (r0 << 0);

			if (i78 == 3)
			{
				const bool i5 = isBitSet(blockModeData, 5);
				blockMode.weightGridWidth	= i5 ? 10 : 6;
				blockMode.weightGridHeight	= i5 ? 6  : 10;
			}
			else
			{
				const deUint32 a = getBits(blockModeData, 5, 6);
				switch (i78)
				{
					case 0:		blockMode.weightGridWidth = 12;		blockMode.weightGridHeight = a + 2;									break;
					case 1:		blockMode.weightGridWidth = a + 2;	blockMode.weightGridHeight = 12;									break;
					case 2:		blockMode.weightGridWidth = a + 6;	blockMode.weightGridHeight = getBits(blockModeData, 9, 10) + 6;		break;
					default: DE_ASSERT(false);
				}
			}
		}
		else
		{
			const deUint32 r0	= getBit(blockModeData, 4);
			const deUint32 r1	= getBit(blockModeData, 0);
			const deUint32 r2	= getBit(blockModeData, 1);
			const deUint32 i23	= getBits(blockModeData, 2, 3);
			const deUint32 a	= getBits(blockModeData, 5, 6);

			r = (r2 << 2) | (r1 << 1) | (r0 << 0);

			if (i23 == 3)
			{
				const deUint32	b	= getBit(blockModeData, 7);
				const bool		i8	= isBitSet(blockModeData, 8);
				blockMode.weightGridWidth	= i8 ? b+2 : a+2;
				blockMode.weightGridHeight	= i8 ? a+2 : b+6;
			}
			else
			{
				const deUint32 b = getBits(blockModeData, 7, 8);

				switch (i23)
				{
					case 0:		blockMode.weightGridWidth = b + 4;	blockMode.weightGridHeight = a + 2;	break;
					case 1:		blockMode.weightGridWidth = b + 8;	blockMode.weightGridHeight = a + 2;	break;
					case 2:		blockMode.weightGridWidth = a + 2;	blockMode.weightGridHeight = b + 8;	break;
					default: DE_ASSERT(false);
				}
			}
		}

		const bool	zeroDH		= getBits(blockModeData, 0, 1) == 0 && getBits(blockModeData, 7, 8) == 2;
		const bool	h			= zeroDH ? 0 : isBitSet(blockModeData, 9);
		blockMode.isDualPlane	= zeroDH ? 0 : isBitSet(blockModeData, 10);

		{
			ISEMode&	m	= blockMode.weightISEParams.mode;
			int&		b	= blockMode.weightISEParams.numBits;
			m = ISEMODE_PLAIN_BIT;
			b = 0;

			if (h)
			{
				switch (r)
				{
					case 2:							m = ISEMODE_QUINT;	b = 1;	break;
					case 3:		m = ISEMODE_TRIT;						b = 2;	break;
					case 4:												b = 4;	break;
					case 5:							m = ISEMODE_QUINT;	b = 2;	break;
					case 6:		m = ISEMODE_TRIT;						b = 3;	break;
					case 7:												b = 5;	break;
					default:	DE_ASSERT(false);
				}
			}
			else
			{
				switch (r)
				{
					case 2:												b = 1;	break;
					case 3:		m = ISEMODE_TRIT;								break;
					case 4:												b = 2;	break;
					case 5:							m = ISEMODE_QUINT;			break;
					case 6:		m = ISEMODE_TRIT;						b = 1;	break;
					case 7:												b = 3;	break;
					default:	DE_ASSERT(false);
				}
			}
		}
	}

	blockMode.isError = false;
	return blockMode;
}